

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialStatistics.cpp
# Opt level: O1

int __thiscall OpenMD::SlabStatistics::getBin(SlabStatistics *this,Vector3d *pos)

{
  uint uVar1;
  
  Snapshot::wrapVector((this->super_SpatialStatistics).currentSnapshot_,pos);
  uVar1 = (this->super_SpatialStatistics).super_StaticAnalyser.nBins_;
  return (uint)(int)(((pos->super_Vector<double,_3U>).data_[(uint)this->axis_] /
                      *(double *)
                       ((long)(this->hmat_).super_SquareMatrix<double,_3>.
                              super_RectMatrix<double,_3U,_3U>.data_ +
                       (ulong)(uint)this->axis_ * 0x20) + 0.5) * (double)uVar1) % uVar1;
}

Assistant:

int SlabStatistics::getBin(Vector3d pos) {
    currentSnapshot_->wrapVector(pos);
    // which bin is this stuntdouble in?
    // wrapped positions are in the range [-0.5*hmat(2,2), +0.5*hmat(2,2)]
    // Shift molecules by half a box to have bins start at 0
    // The modulo operator is used to wrap the case when we are
    // beyond the end of the bins back to the beginning.
    return int(nBins_ * (pos[axis_] / hmat_(axis_, axis_) + 0.5)) % nBins_;
  }